

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_emitPerfSymbolFor(sysbvm_bytecodeJit_t *jit,uint8_t *instructionsPointers)

{
  uint8_t *instructionsPointers_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  return;
}

Assistant:

static void sysbvm_jit_emitPerfSymbolFor(sysbvm_bytecodeJit_t *jit, uint8_t *instructionsPointers)
{
#if defined(__linux__) && defined(SYSBVM_EMIT_PERF_STACK_MAP)
    static int sysbvm_jit_perfMapFD;

    char buffer[2048];

    if(!sysbvm_jit_perfMapFD)
    {
        snprintf(buffer, sizeof(buffer), "/tmp/perf-%d.map", getpid());
        sysbvm_jit_perfMapFD = open(buffer, O_WRONLY | O_CREAT | O_TRUNC, 0644);
    }

    if(sysbvm_jit_perfMapFD < 0) return;

    int symbolRecordSize = snprintf(buffer, sizeof(buffer), "%llx %llx %s\n", (long long)instructionsPointers, (long long)jit->instructions.size, (const char *)jit->objectFileContent.data + jit->objectFileContentJittedFunctionNameOffset);
    ssize_t writeSize = write(sysbvm_jit_perfMapFD, buffer, symbolRecordSize);
    if(writeSize != symbolRecordSize)
        perror("Failed write map file entry");
#else
    (void)jit;
    (void)instructionsPointers;
#endif
}